

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O2

_Bool golf_editor_is_edit_entity_selected(golf_edit_mode_entity_t entity)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  _Bool _Var4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  golf_edit_mode_entity_t entity1;
  
  lVar8 = (long)editor.edit_mode.selected_entities.length;
  uVar7 = 0;
  if (0 < editor.edit_mode.selected_entities.length) {
    uVar7 = (ulong)(uint)editor.edit_mode.selected_entities.length;
  }
  piVar6 = &(editor.edit_mode.selected_entities.data)->idx2;
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (uVar7 == uVar5) break;
    uVar1 = ((golf_edit_mode_entity_t *)(piVar6 + -2))->type;
    uVar2 = ((golf_edit_mode_entity_t *)(piVar6 + -2))->idx;
    entity1.idx = uVar2;
    entity1.type = uVar1;
    entity1.idx2 = *piVar6;
    _Var4 = golf_editor_edit_entities_compare(entity,entity1);
    piVar6 = piVar6 + 3;
    uVar3 = uVar5 + 1;
  } while (!_Var4);
  return (long)uVar5 < lVar8;
}

Assistant:

bool golf_editor_is_edit_entity_selected(golf_edit_mode_entity_t entity) {
    for (int i = 0; i < editor.edit_mode.selected_entities.length; i++) {
        golf_edit_mode_entity_t entity2 = editor.edit_mode.selected_entities.data[i];
        if (golf_editor_edit_entities_compare(entity, entity2)) {
            return true;
        }
    }
    return false;
}